

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  int kj;
  void *pvVar29;
  int iVar30;
  ulong uVar31;
  int k;
  ulong uVar32;
  float fVar33;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_150;
  void *local_120;
  void *local_110;
  void *local_f8;
  ulong local_e8;
  ulong local_e0;
  allocator_type local_d1;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  Mat local_a8;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar12 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar31 = (ulong)uVar3;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    local_c8 = uVar31;
    if (this->adaptive_pooling == 0) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      make_padding(this,bottom_blob,&local_a8,opt);
      iVar4 = local_a8.h;
      iVar2 = local_a8.w;
      iVar24 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        iVar10 = (local_a8.w - this->kernel_w) / this->stride_w;
        iVar14 = (local_a8.h - this->kernel_h) / this->stride_h;
        uVar22 = iVar10 + 1;
        uVar12 = iVar14 + 1;
        Mat::create(top_blob,uVar22,uVar12,uVar3,sVar5,opt->blob_allocator);
        iVar24 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar31 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar31,&local_d1);
          iVar24 = this->kernel_h;
          if (0 < iVar24) {
            iVar11 = this->kernel_w;
            iVar25 = iVar2 - iVar11;
            iVar13 = 0;
            iVar16 = 0;
            iVar23 = 0;
            do {
              if (0 < iVar11) {
                lVar15 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar23 + lVar15] = iVar16 + (int)lVar15;
                  iVar11 = this->kernel_w;
                  lVar15 = lVar15 + 1;
                  iVar30 = (int)lVar15;
                } while (iVar30 < iVar11);
                iVar23 = iVar23 + iVar30;
                iVar24 = this->kernel_h;
                iVar16 = iVar16 + iVar30;
              }
              iVar16 = iVar16 + iVar25;
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar24);
          }
          iVar24 = (int)uVar31;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar24 = 0;
              iVar11 = 0;
              if (this->pad_mode == 0) {
                iVar24 = (bottom_blob->w - local_a8.w) + this->pad_left + this->pad_right;
                iVar11 = (bottom_blob->h - local_a8.h) + this->pad_top + this->pad_bottom;
              }
              if (0 < (int)uVar3) {
                local_b0 = local_a8.data;
                local_58 = top_blob->data;
                local_60 = top_blob->cstep * top_blob->elemsize;
                local_c0 = (long)this->stride_h;
                local_50 = local_a8.cstep *
                           CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                lVar15 = (long)local_a8.w *
                         CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                local_b8 = lVar15 * local_c0;
                local_d0 = 0;
                do {
                  if (-1 < iVar14) {
                    local_120 = (void *)(local_60 * local_d0 + (long)local_58);
                    iVar25 = this->stride_w;
                    uVar3 = this->kernel_h;
                    local_f8 = local_b0;
                    local_110 = (void *)0x0;
                    do {
                      if (-1 < iVar10) {
                        iVar13 = this->pad_top;
                        lVar20 = 0;
                        uVar31 = 0;
                        pvVar21 = local_f8;
                        do {
                          fVar33 = NAN;
                          if (0 < (int)uVar3) {
                            fVar33 = 0.0;
                            uVar26 = 0;
                            iVar16 = 0;
                            pvVar17 = pvVar21;
                            do {
                              lVar18 = uVar26 + (long)local_110 * local_c0;
                              if (iVar13 <= lVar18) {
                                if ((iVar11 + iVar4) - this->pad_bottom <= lVar18) break;
                                if (0 < this->kernel_w) {
                                  uVar27 = 0;
                                  do {
                                    if ((long)this->pad_left <= (long)(lVar20 + uVar27)) {
                                      if ((long)((iVar24 + iVar2) - this->pad_right) <=
                                          (long)(lVar20 + uVar27)) break;
                                      fVar33 = fVar33 + *(float *)((long)pvVar17 + uVar27 * 4);
                                      iVar16 = iVar16 + 1;
                                    }
                                    uVar27 = uVar27 + 1;
                                  } while ((uint)this->kernel_w != uVar27);
                                }
                              }
                              uVar26 = uVar26 + 1;
                              pvVar17 = (void *)((long)pvVar17 + lVar15);
                            } while (uVar26 != uVar3);
                            fVar33 = fVar33 / (float)iVar16;
                          }
                          *(float *)((long)local_120 + uVar31 * 4) = fVar33;
                          uVar31 = uVar31 + 1;
                          pvVar21 = (void *)((long)pvVar21 + (long)iVar25 * 4);
                          lVar20 = lVar20 + iVar25;
                        } while (uVar31 != uVar22);
                      }
                      local_120 = (void *)((long)local_120 + (long)(int)uVar22 * 4);
                      local_110 = (void *)((long)local_110 + 1);
                      local_f8 = (void *)((long)local_f8 + local_b8);
                    } while (local_110 != (void *)(ulong)uVar12);
                  }
                  local_d0 = local_d0 + 1;
                  local_b0 = (void *)((long)local_b0 + local_50);
                } while (local_d0 != local_c8);
              }
            }
            else if (0 < (int)uVar3) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar21 = top_blob->data;
              local_150 = 0;
              do {
                if (-1 < iVar14) {
                  pvVar17 = (void *)(sVar5 * sVar6 * local_150 + (long)pvVar21);
                  iVar2 = this->stride_h;
                  iVar4 = this->stride_w;
                  uVar26 = 0;
                  do {
                    if (-1 < iVar10) {
                      uVar27 = 0;
                      do {
                        if (iVar24 < 1) {
                          fVar33 = 0.0;
                        }
                        else {
                          fVar33 = 0.0;
                          uVar32 = 0;
                          do {
                            fVar33 = fVar33 + *(float *)((long)local_a8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar32] *
                                                  4 + uVar27 * (long)iVar4 * 4 +
                                                      uVar26 * (long)iVar2 *
                                                               (long)local_a8.w *
                                                               CONCAT44(local_a8.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_a8.elemsize) +
                                                      local_a8.cstep *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) *
                                                      local_150);
                            uVar32 = uVar32 + 1;
                          } while ((uVar31 & 0xffffffff) != uVar32);
                        }
                        *(float *)((long)pvVar17 + uVar27 * 4) = fVar33 * (1.0 / (float)iVar24);
                        uVar27 = uVar27 + 1;
                      } while (uVar27 != uVar22);
                    }
                    pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar22 * 4);
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar12);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_c8);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar3)) {
            pvVar21 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            local_150 = 0;
            do {
              if (-1 < iVar14) {
                pvVar17 = (void *)(sVar5 * sVar6 * local_150 + (long)pvVar21);
                iVar2 = this->stride_h;
                iVar4 = this->stride_w;
                uVar26 = 0;
                do {
                  if (-1 < iVar10) {
                    lVar15 = uVar26 * (long)iVar2 *
                                      (long)local_a8.w *
                                      CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize
                                              ) +
                             local_a8.cstep *
                             CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                             local_150;
                    uVar27 = 0;
                    do {
                      lVar20 = uVar27 * (long)iVar4;
                      fVar33 = *(float *)((long)local_a8.data + lVar20 * 4 + lVar15);
                      if (0 < iVar24) {
                        uVar32 = 0;
                        do {
                          fVar1 = *(float *)((long)local_a8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar32] *
                                            4 + lVar20 * 4 + lVar15);
                          if (fVar33 <= fVar1) {
                            fVar33 = fVar1;
                          }
                          uVar32 = uVar32 + 1;
                        } while ((uVar31 & 0xffffffff) != uVar32);
                      }
                      *(float *)((long)pvVar17 + uVar27 * 4) = fVar33;
                      uVar27 = uVar27 + 1;
                    } while (uVar27 != uVar22);
                  }
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar22 * 4);
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar12);
              }
              local_150 = local_150 + 1;
            } while (local_150 != local_c8);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar24 = 0;
        }
      }
      piVar7 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uVar22 = uVar12;
      if (this->out_w != 0xffffff17) {
        uVar22 = this->out_w;
      }
      iVar4 = this->out_h;
      if (this->out_h == -0xe9) {
        iVar4 = iVar2;
      }
      if (iVar4 == iVar2 && uVar22 == uVar12) {
        iVar24 = 0;
        if (top_blob != bottom_blob) {
          piVar7 = bottom_blob->refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = top_blob->refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar24 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar7 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar7;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar2 = bottom_blob->w;
          iVar4 = bottom_blob->h;
          iVar10 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar2;
          top_blob->h = iVar4;
          top_blob->d = iVar10;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
      }
      else {
        Mat::create(top_blob,uVar22,iVar4,uVar3,sVar5,opt->blob_allocator);
        pvVar21 = top_blob->data;
        iVar24 = -100;
        if ((pvVar21 != (void *)0x0) && (sVar5 = top_blob->cstep, (long)top_blob->c * sVar5 != 0)) {
          iVar24 = 0;
          if (this->pooling_type == 0) {
            if (0 < (int)uVar3) {
              lVar20 = bottom_blob->cstep * bottom_blob->elemsize;
              sVar6 = top_blob->elemsize;
              pvVar17 = bottom_blob->data;
              lVar15 = (long)(int)uVar12 * 4;
              local_e8 = 0;
              local_110 = pvVar17;
              do {
                if (0 < iVar4) {
                  pvVar28 = (void *)(sVar5 * sVar6 * local_e8 + (long)pvVar21);
                  iVar24 = 0;
                  do {
                    iVar10 = iVar24 + 1;
                    if (0 < (int)uVar22) {
                      iVar14 = (iVar10 * iVar2 + iVar4 + -1) / iVar4;
                      iVar24 = (iVar24 * iVar2) / iVar4;
                      uVar31 = 0;
                      do {
                        iVar11 = (int)((int)uVar31 * uVar12) / (int)uVar22;
                        uVar26 = uVar31 + 1;
                        fVar33 = *(float *)((long)pvVar17 +
                                           (long)(int)(iVar11 + iVar24 * uVar12) * 4 +
                                           lVar20 * local_e8);
                        if (iVar24 < iVar14) {
                          iVar25 = (int)((int)uVar26 * uVar12 + (uVar22 - 1)) / (int)uVar22;
                          lVar18 = (long)iVar24;
                          pvVar29 = (void *)(lVar15 * iVar24 + (long)local_110);
                          do {
                            lVar19 = (long)iVar11;
                            if (iVar11 < iVar25) {
                              do {
                                fVar1 = *(float *)((long)pvVar29 + lVar19 * 4);
                                if (fVar33 <= fVar1) {
                                  fVar33 = fVar1;
                                }
                                lVar19 = lVar19 + 1;
                              } while (iVar25 != lVar19);
                            }
                            lVar18 = lVar18 + 1;
                            pvVar29 = (void *)((long)pvVar29 + lVar15);
                          } while (lVar18 != iVar14);
                        }
                        *(float *)((long)pvVar28 + uVar31 * 4) = fVar33;
                        uVar31 = uVar26;
                      } while (uVar26 != uVar22);
                    }
                    pvVar28 = (void *)((long)pvVar28 + (long)(int)uVar22 * 4);
                    iVar24 = iVar10;
                  } while (iVar10 != iVar4);
                }
                local_e8 = local_e8 + 1;
                local_110 = (void *)((long)local_110 + lVar20);
                iVar24 = 0;
              } while (local_e8 != local_c8);
            }
          }
          else if ((this->pooling_type == 1) && (0 < (int)uVar3)) {
            local_f8 = bottom_blob->data;
            sVar6 = bottom_blob->cstep;
            sVar8 = top_blob->elemsize;
            sVar9 = bottom_blob->elemsize;
            lVar15 = (long)(int)uVar12 * 4;
            local_e0 = 0;
            do {
              if (0 < iVar4) {
                pvVar17 = (void *)(sVar5 * sVar8 * local_e0 + (long)pvVar21);
                iVar24 = 0;
                do {
                  iVar10 = iVar24 + 1;
                  if (0 < (int)uVar22) {
                    iVar14 = (iVar10 * iVar2 + iVar4 + -1) / iVar4;
                    iVar24 = (iVar24 * iVar2) / iVar4;
                    uVar31 = 0;
                    do {
                      iVar25 = (int)((int)uVar31 * uVar12) / (int)uVar22;
                      uVar26 = uVar31 + 1;
                      iVar11 = (int)((int)uVar26 * uVar12 + (uVar22 - 1)) / (int)uVar22;
                      fVar33 = 0.0;
                      if (iVar24 < iVar14) {
                        lVar20 = (long)iVar24;
                        pvVar28 = (void *)(lVar15 * iVar24 + (long)local_f8);
                        do {
                          lVar18 = (long)iVar25;
                          if (iVar25 < iVar11) {
                            do {
                              fVar33 = fVar33 + *(float *)((long)pvVar28 + lVar18 * 4);
                              lVar18 = lVar18 + 1;
                            } while (iVar11 != lVar18);
                          }
                          lVar20 = lVar20 + 1;
                          pvVar28 = (void *)((long)pvVar28 + lVar15);
                        } while (lVar20 != iVar14);
                      }
                      *(float *)((long)pvVar17 + uVar31 * 4) =
                           fVar33 / ((float)(iVar11 - iVar25) * (float)(iVar14 - iVar24));
                      uVar31 = uVar26;
                    } while (uVar26 != uVar22);
                  }
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar22 * 4);
                  iVar24 = iVar10;
                } while (iVar10 != iVar4);
              }
              local_e0 = local_e0 + 1;
              local_f8 = (void *)((long)local_f8 + sVar6 * sVar9);
              iVar24 = 0;
            } while (local_e0 != local_c8);
          }
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar5,opt->blob_allocator);
    pvVar21 = top_blob->data;
    iVar24 = -100;
    if ((pvVar21 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar12 = iVar2 * uVar12;
      if (this->pooling_type == 0) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        lVar15 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar17 = bottom_blob->data;
        uVar26 = 0;
        pvVar28 = pvVar17;
        do {
          fVar33 = *(float *)((long)pvVar17 + lVar15 * uVar26);
          if (0 < (int)uVar12) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
              if (fVar33 <= fVar1) {
                fVar33 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar12 != uVar27);
          }
          *(float *)((long)pvVar21 + uVar26 * 4) = fVar33;
          uVar26 = uVar26 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar15);
        } while (uVar26 != uVar31);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        sVar5 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        pvVar17 = bottom_blob->data;
        uVar26 = 0;
        do {
          if ((int)uVar12 < 1) {
            fVar33 = 0.0;
          }
          else {
            fVar33 = 0.0;
            uVar27 = 0;
            do {
              fVar33 = fVar33 + *(float *)((long)pvVar17 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar12 != uVar27);
          }
          *(float *)((long)pvVar21 + uVar26 * 4) = fVar33 * (1.0 / (float)(int)uVar12);
          uVar26 = uVar26 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar5 * sVar6);
        } while (uVar26 != uVar31);
      }
      iVar24 = 0;
    }
  }
  return iVar24;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;

        if (_out_w == w && _out_h == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += _out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += _out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}